

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffgknm(char *card,char *name,int *length,int *status)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  
  *name = '\0';
  *length = 0;
  if (*card == 'H') {
    iVar2 = strncmp(card,"HIERARCH ",9);
    if (iVar2 != 0) goto LAB_001b14cb;
    pcVar4 = strchr(card,0x3d);
    if (pcVar4 == (char *)0x0) {
      sVar5 = strlen(name);
      builtin_strncpy(name + sVar5,"HIERARCH",9);
      uVar7 = 8;
      goto LAB_001b1581;
    }
    lVar3 = 0;
    do {
      lVar6 = lVar3;
      lVar3 = lVar6 + 1;
    } while (card[lVar6 + 9] == ' ');
    strncat(name,card + lVar6 + 9,(size_t)(pcVar4 + (-lVar3 - (long)card) + -8));
    uVar7 = (ulong)(((int)pcVar4 - (int)card) - 8) - lVar3;
    if (0 < (int)uVar7) {
      do {
        iVar2 = (int)uVar7;
        if (name[(uVar7 & 0xffffffff) - 1] != ' ') goto LAB_001b1579;
        uVar7 = (ulong)(iVar2 - 1);
      } while (1 < iVar2);
      uVar7 = 0;
    }
LAB_001b1579:
    lVar3 = (long)(int)uVar7;
  }
  else {
LAB_001b14cb:
    uVar7 = 0;
    do {
      bVar1 = card[uVar7];
      if (((ulong)bVar1 < 0x3e) && ((0x2000000100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        name[uVar7] = '\0';
        goto LAB_001b1581;
      }
      name[uVar7] = bVar1;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x4a);
    uVar7 = 0x4a;
    lVar3 = 0x4a;
  }
  name[lVar3] = '\0';
LAB_001b1581:
  *length = (int)uVar7;
  return *status;
}

Assistant:

int ffgknm( char *card,         /* I - keyword card                   */
            char *name,         /* O - name of the keyword            */
            int *length,        /* O - length of the keyword name     */
            int  *status)       /* IO - error status                  */

/*
  Return the name of the keyword, and the name length.  This supports the
  ESO HIERARCH convention where keyword names may be > 8 characters long.
*/
{
    char *ptr1, *ptr2;
    int ii, namelength;

    namelength = FLEN_KEYWORD - 1;
    *name = '\0';
    *length = 0;

    /* support for ESO HIERARCH keywords; find the '=' */
    if (FSTRNCMP(card, "HIERARCH ", 9) == 0)
    {
        ptr2 = strchr(card, '=');

        if (!ptr2)   /* no value indicator ??? */
        {
            /* this probably indicates an error, so just return FITS name */
            strcat(name, "HIERARCH");
            *length = 8;
            return(*status);
        }

        /* find the start and end of the HIERARCH name */
        ptr1 = &card[9];
        while (*ptr1 == ' ')   /* skip spaces */
            ptr1++;

        strncat(name, ptr1, ptr2 - ptr1);
        ii = ptr2 - ptr1;

        while (ii > 0 && name[ii - 1] == ' ')  /* remove trailing spaces */
            ii--;

        name[ii] = '\0';
        *length = ii;
    }
    else
    {
        for (ii = 0; ii < namelength; ii++)
        {
           /* look for string terminator, or a blank */
           if (*(card+ii) != ' ' && *(card+ii) != '=' && *(card+ii) !='\0')
           {
               *(name+ii) = *(card+ii);
           }
           else
           {
               name[ii] = '\0';
               *length = ii;
               return(*status);
           }
        }

        /* if we got here, keyword is namelength characters long */
        name[namelength] = '\0';
        *length = namelength;
    }

    return(*status);
}